

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall POMDPFormatParsing::ParserPOMDPFormat_Spirit::Parse(ParserPOMDPFormat_Spirit *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider fileName;
  ostream *poVar2;
  undefined8 *puVar3;
  int iVar4;
  CommentBlankorNewLineParser *in_R9;
  string pf;
  iterator_t_fi first_fi;
  string unparsed;
  iterator_t st;
  iterator_t_fi last_fi;
  CommentBlankorNewLineParser skip_parser;
  POMDPFileParser pomdpfp;
  iterator_t last;
  type tmp;
  iterator_t st2;
  iterator_t first;
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  info;
  allocator<char> local_599;
  string local_598;
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_> local_578;
  string local_560;
  char *local_540;
  long local_538;
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  local_520;
  shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping> local_4a8;
  char *local_498;
  undefined1 local_488 [24];
  code *local_470;
  grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>
  local_468;
  ParserPOMDPFormat_Spirit *local_438;
  POMDPDiscrete *local_430;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_428;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_3c0;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_358;
  position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
  local_2f0 [8];
  shared_count local_2e8 [4];
  shared_count local_2c8 [2];
  long *local_2b8;
  long local_2a8 [4];
  undefined1 local_288 [40];
  shared_count local_260 [2];
  file_position local_250;
  undefined8 local_220;
  size_t sStack_218;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_100;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_98;
  
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            (&local_598,(MultiAgentDecisionProcess *)this->_m_decPOMDPDiscrete);
  fileName._M_p = local_598._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,local_598._M_dataplus._M_p,(allocator<char> *)local_288);
  boost::spirit::classic::
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::
  file_iterator(&local_578,&local_560);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if (local_578.super_type.m_iterator.m_mem.px == (element_type *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_288 + 0x10),"Unable to open file: ",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_288 + 0x10),local_598._M_dataplus._M_p,
                        local_598._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," !\n",3);
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar3 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar3,&E::typeinfo,E::~E);
  }
  local_4a8.px = (element_type *)0x0;
  local_4a8.pn.pi_ = (sp_counted_base *)0x0;
  local_498 = local_578.super_type.m_iterator.m_curChar;
  boost::shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping>::
  operator=(&local_4a8,
            (shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping> *)
            &local_578);
  local_498 = (char *)((long)(local_4a8.px)->data + (local_4a8.px)->size);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
  ::position_iterator<char_const*>
            (local_2f0,&local_578,
             (file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
              *)&local_4a8,fileName._M_p);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_428);
  boost::spirit::classic::impl::
  object_with_id<boost::spirit::classic::impl::grammar_tag,_unsigned_long>::object_with_id
            (&local_468.
              super_object_with_id<boost::spirit::classic::impl::grammar_tag,_unsigned_long>);
  local_468.helpers.helpers.
  super__Vector_base<boost::spirit::classic::impl::grammar_helper_base<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>_>_*,_std::allocator<boost::spirit::classic::impl::grammar_helper_base<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.helpers.helpers.
  super__Vector_base<boost::spirit::classic::impl::grammar_helper_base<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>_>_*,_std::allocator<boost::spirit::classic::impl::grammar_helper_base<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.helpers.helpers.
  super__Vector_base<boost::spirit::classic::impl::grammar_helper_base<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>_>_*,_std::allocator<boost::spirit::classic::impl::grammar_helper_base<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_430 = this->_m_decPOMDPDiscrete;
  local_488._0_8_ = comment_cobp::commentOrBlankParser_p;
  local_488._8_8_ = comment_cbonlp::anon_unknown_1::cbonlp_comment_or_blank;
  local_470 = comment_cbonlp::anon_unknown_1::cbonlp_eol;
  local_438 = this;
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_520.stop);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator((position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                       *)local_288,&local_520.stop);
  local_220 = local_220 & 0xffffffffffff0000;
  sStack_218 = 0;
  paVar1 = &local_520.stop._pos.
            super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.stop._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p != paVar1) {
    operator_delete(local_520.stop._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_520.stop._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_520.stop._end.super_type.m_iterator.m_mem + 8));
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_520.stop.super_type.m_iterator.super_type.m_iterator + 8)
            );
  local_358.super_type.m_iterator.super_type.m_iterator.m_mem.px = (element_type *)&local_468;
  boost::spirit::classic::impl::phrase_parser<comment_cbonlp::CommentBlankorNewLineParser>::
  parse<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::sequence<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::optional<boost::spirit::classic::end_parser>>>
            (&local_520,(phrase_parser<comment_cbonlp::CommentBlankorNewLineParser> *)local_2f0,
             &local_428,&local_358,
             (sequence<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::optional<boost::spirit::classic::end_parser>_>
              *)local_488,in_R9);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::operator=((position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
               *)local_288,&local_520.stop);
  local_220._0_1_ = local_520.hit;
  local_220._1_1_ = local_520.full;
  local_220._2_6_ = local_520._106_6_;
  sStack_218 = local_520.length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.stop._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p != paVar1) {
    operator_delete(local_520.stop._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_520.stop._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_520.stop._end.super_type.m_iterator.m_mem + 8));
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_520.stop.super_type.m_iterator.super_type.m_iterator + 8)
            );
  if (local_220._1_1_ != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.
           super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .file._M_dataplus._M_p !=
        &local_250.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file.field_2) {
      operator_delete(local_250.
                      super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .file._M_dataplus._M_p,
                      local_250.
                      super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .file.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(local_260);
    boost::detail::shared_count::~shared_count((shared_count *)(local_288 + 8));
    boost::spirit::classic::
    grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>
    ::~grammar(&local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._pos.
           super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .file._M_dataplus._M_p !=
        &local_428._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file.field_2) {
      operator_delete(local_428._pos.
                      super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .file._M_dataplus._M_p,
                      local_428._pos.
                      super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .file.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(&local_428._end.super_type.m_iterator.m_mem.pn);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&local_428.super_type.m_iterator.super_type.m_iterator.m_mem + 8));
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
    boost::detail::shared_count::~shared_count(local_2c8);
    boost::detail::shared_count::~shared_count(local_2e8);
    boost::detail::shared_count::~shared_count(&local_4a8.pn);
    boost::detail::shared_count::~shared_count(&local_578.super_type.m_iterator.m_mem.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_520.stop,
                      (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                       *)local_288);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_358,
                      (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                       *)local_288);
  iVar4 = 199;
  do {
    if ((local_358._isend == local_428._isend) &&
       ((local_358._isend != false ||
        (local_358.super_type.m_iterator.super_type.m_iterator.m_curChar ==
         local_428.super_type.m_iterator.super_type.m_iterator.m_curChar)))) break;
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::position_iterator(&local_3c0,&local_358);
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::increment(&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._pos.
           super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .file._M_dataplus._M_p !=
        &local_3c0._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file.field_2) {
      operator_delete(local_3c0._pos.
                      super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .file._M_dataplus._M_p,
                      local_3c0._pos.
                      super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .file.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(&local_3c0._end.super_type.m_iterator.m_mem.pn);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&local_3c0.super_type.m_iterator.super_type.m_iterator.m_mem + 8));
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_98,&local_520.stop);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_100,&local_358);
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            ((string *)&local_540,&local_98,&local_100,&local_599);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&local_100);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stopped at: ",0xc);
  poVar2 = POMDPFormatParsing::operator<<((ostream *)&std::cout,&local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-> unparsed : ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_540,local_538);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"partial match? hit: \"",0x15);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"consumed chars - length: \"",0x1a);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  puVar3[1] = puVar3 + 3;
  std::__cxx11::string::_M_construct<char_const*>((string *)(puVar3 + 1),"Parsing failed","");
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::Parse()
{
    string pf = GetPOMDPDiscrete()->GetProblemFile();
    const char* pf_c = pf.c_str();
    // Create a file iterator for this file
    iterator_t_fi first_fi(pf_c);
    if (!first_fi)
    {
        stringstream ss; ss << "Unable to open file: "<<pf<<" !\n";
        throw E(ss);
    }
    iterator_t_fi last_fi = first_fi.make_end();// Create an EOF iterator

    iterator_t first( first_fi, last_fi, pf_c );
    iterator_t last;

    POMDPFileParser pomdpfp(this);
    comment_cbonlp::CommentBlankorNewLineParser skip_parser;
    parse_info<iterator_t> info; 
    // Parse
    try{
        // Spirit changed when upgrading from 1.33.1 to 1.34.0:
        // trailing spaces are no longer accepted, which the next line
        // to fail on some problems (those with trailing comments). Adding
        // ">> !end_p" to the grammar works around this problem.
        info = parse(first, last , pomdpfp >> !end_p, skip_parser);
        if (info.full)
        {
            if(DEBUG_POMDP_PARSE) cout << ">>>Parsing succeeded\n";
        }
        else
        {
            iterator_t st = info.stop;
            iterator_t st2 = info.stop;
            for(Index i=1;i<200 && st2 != last ;i++)st2++;
            string unparsed(st, st2);
            cout << "stopped at: " << info.stop.get_position() 
                << "-> unparsed : "<< "\"" << unparsed << "\"\n";
            cout << "partial match? hit: \"" << info.hit << "\"\n";
            cout << "consumed chars - length: \"" << info.length << "\"\n";
            throw E("Parsing failed");
        }
    }    
    catch(E& e)
    {
        e.Print();
    }

    if(DEBUG_POMDP_PARSE)  cout << "-------------------------\n";
    return;
}